

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Imputer::Clear(Imputer *this)

{
  uint32_t cached_has_bits;
  Imputer *this_local;
  
  clear_ImputedValue(this);
  clear_ReplaceValue(this);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Imputer::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.Imputer)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  clear_ImputedValue();
  clear_ReplaceValue();
  _internal_metadata_.Clear<std::string>();
}